

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

GLenum deqp::gls::FboUtil::config::attachmentType(Attachment *att)

{
  long local_38;
  long local_28;
  Attachment *att_local;
  
  if (att == (Attachment *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = __dynamic_cast(att,&Attachment::typeinfo,&RenderbufferAttachment::typeinfo,0);
  }
  if (local_28 == 0) {
    if (att == (Attachment *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(att,&Attachment::typeinfo,&TextureAttachment::typeinfo,0);
    }
    if (local_38 == 0) {
      att_local._4_4_ = 0;
    }
    else {
      att_local._4_4_ = 0x1702;
    }
  }
  else {
    att_local._4_4_ = 0x8d41;
  }
  return att_local._4_4_;
}

Assistant:

GLenum attachmentType (const Attachment& att)
{
	if (dynamic_cast<const RenderbufferAttachment*>(&att) != DE_NULL)
		return GL_RENDERBUFFER;
	else if (dynamic_cast<const TextureAttachment*>(&att) != DE_NULL)
		return GL_TEXTURE;

	DE_FATAL("Impossible attachment type");
	return GL_NONE;
}